

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O3

type __thiscall
libtorrent::heterogeneous_queue<libtorrent::alert>::
emplace_back<libtorrent::peer_info_alert,libtorrent::aux::stack_allocator&,libtorrent::torrent_handle,std::vector<libtorrent::v1_2::peer_info,std::allocator<libtorrent::v1_2::peer_info>>>
          (heterogeneous_queue<libtorrent::alert> *this,stack_allocator *args,torrent_handle *args_1
          ,vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_> *args_2
          )

{
  _Atomic_word *p_Var1;
  ushort *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  _Head_base<0UL,_char_*,_false> _Var5;
  int iVar6;
  long lVar7;
  peer_info_alert *this_00;
  uint uVar8;
  torrent_handle local_58;
  vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_> local_48;
  
  lVar7 = (long)this->m_size;
  if ((ulong)(long)this->m_capacity < lVar7 + 0x60U) {
    grow_capacity(this,0x60);
    lVar7 = (long)this->m_size;
  }
  _Var5._M_head_impl =
       (this->m_storage)._M_t.super___uniq_ptr_impl<char,_libtorrent::aux::free_deleter>._M_t.
       super__Tuple_impl<0UL,_char_*,_libtorrent::aux::free_deleter>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  puVar2 = (ushort *)(_Var5._M_head_impl + lVar7);
  uVar8 = -(int)puVar2 - 0x10U & 7;
  _Var5._M_head_impl[lVar7 + 2] = (char)uVar8;
  *(code **)(_Var5._M_head_impl + lVar7 + 8) = move<libtorrent::peer_info_alert>;
  this_00 = (peer_info_alert *)((long)puVar2 + (ulong)uVar8 + 0x10);
  *(ushort *)(_Var5._M_head_impl + lVar7) = -(short)this_00 - 0x48U & 7 | 0x48;
  local_58.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (args_1->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_58.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (args_1->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (args_1->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (args_1->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.
  super__Vector_base<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (args_2->
       super__Vector_base<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (args_2->
       super__Vector_base<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (args_2->
       super__Vector_base<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_2->
  super__Vector_base<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args_2->
  super__Vector_base<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (args_2->
  super__Vector_base<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peer_info_alert::peer_info_alert(this_00,args,&local_58,&local_48);
  ::std::vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>::~vector
            (&local_48);
  if (local_58.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_58.m_torrent.
                 super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_weak_count;
      iVar6 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar6 = (local_58.m_torrent.
               super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_weak_count;
      (local_58.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = iVar6 + -1;
    }
    if (iVar6 == 1) {
      (*(local_58.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  uVar3 = this->m_size;
  uVar4 = this->m_num_items;
  this->m_size = uVar8 + 0x10 + (uint)*puVar2 + uVar3;
  this->m_num_items = uVar4 + 1;
  return this_00;
}

Assistant:

typename std::enable_if<std::is_base_of<T, U>::value, U&>::type
		emplace_back(Args&&... args)
		{
			// make the conservative assumption that we'll need the maximum padding
			// for this object, just for purposes of growing the storage
			if (std::size_t(m_size) + sizeof(header_t) + alignof(U) + sizeof(U) > std::size_t(m_capacity))
				grow_capacity(sizeof(header_t) + alignof(U) + sizeof(U));

			char* ptr = m_storage.get() + m_size;

			std::size_t const pad_bytes = aux::calculate_pad_bytes(ptr + sizeof(header_t), alignof(U));

			// pad_bytes is only 8 bits in the header, so types that need more than
			// 256 byte alignment may not be supported
			static_assert(alignof(U) <= 256
				, "heterogeneous_queue does not support types with alignment requirements > 256");

#ifdef TORRENT_ADDRESS_SANITIZER
			std::size_t const hdr_len = sizeof(U)
				+ aux::calculate_pad_bytes(ptr + sizeof(header_t) + pad_bytes + sizeof(U)
					, alignof(header_t));

			int const new_size = m_size + int(sizeof(header_t) + pad_bytes + hdr_len);

			__sanitizer_annotate_contiguous_container(
				m_storage.get()
				, m_storage.get() + m_capacity
				, ptr
				, m_storage.get() + new_size);
#endif

			// if this assert triggers, the type being added to the queue has
			// alignment requirements stricter than what malloc() returns. This is
			// not supported
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(m_storage.get())
				& (alignof(U) - 1)) == 0);

			// make sure the current position in the storage is aligned for
			// creating a heder_t object
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(header_t) - 1)) == 0);

			// length prefix
			header_t* hdr = new (ptr) header_t;
			hdr->pad_bytes = static_cast<std::uint8_t>(pad_bytes);
			hdr->move = &move<U>;
			ptr += sizeof(header_t) + pad_bytes;
			hdr->len = static_cast<std::uint16_t>(sizeof(U)
				+ aux::calculate_pad_bytes(ptr + sizeof(U), alignof(header_t)));

			// make sure ptr is correctly aligned for the object we're about to
			// create there
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(U) - 1)) == 0);

			// construct in-place
			U* const ret = new (ptr) U(std::forward<Args>(args)...);

			// if we constructed the object without throwing any exception
			// update counters to indicate the new item is in there
			++m_num_items;
			m_size += int(sizeof(header_t) + pad_bytes + hdr->len);
#ifdef TORRENT_ADDRESS_SANITIZER
			TORRENT_ASSERT(m_size == new_size);
#endif
			return *ret;
		}